

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O2

void __thiscall
Array3dTest_Constructor_Test::~Array3dTest_Constructor_Test(Array3dTest_Constructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Array3dTest, Constructor)
{
    Array3d<double> a(4, 5, 2);
    ASSERT_TRUE(Array3d<double>::IndexType(4, 5, 2) == a.getSize());
    for (int i = 0; i < a.getSize().x; i++)
    for (int j = 0; j < a.getSize().y; j++)
    for (int k = 0; k < a.getSize().z; k++)
        ASSERT_EQ(0, a(i, j, k));
    Array3d<int> b(Array3d<double>::IndexType(5, 2, 4), 10);
    ASSERT_TRUE(Array3d<double>::IndexType(5, 2, 4) == b.getSize());
    for (int i = 0; i < b.getSize().x; i++)
    for (int j = 0; j < b.getSize().y; j++)
    for (int k = 0; k < b.getSize().z; k++)
        ASSERT_EQ(10, b(i, j, k));
}